

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo>::DoCopy
          (TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo> *this,
          TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo> *other)

{
  uint uVar1;
  undefined4 uVar2;
  WeaponInfo *pWVar3;
  WeaponInfo *pWVar4;
  uint local_1c;
  uint i;
  TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo> *other_local;
  TArray<FWeaponSlot::WeaponInfo,_FWeaponSlot::WeaponInfo> *this_local;
  
  uVar1 = other->Count;
  this->Count = uVar1;
  this->Most = uVar1;
  if (this->Count == 0) {
    this->Array = (WeaponInfo *)0x0;
  }
  else {
    pWVar3 = (WeaponInfo *)
             M_Malloc_Dbg((ulong)this->Most << 4,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/tarray.h"
                          ,0x199);
    this->Array = pWVar3;
    for (local_1c = 0; local_1c < this->Count; local_1c = local_1c + 1) {
      pWVar3 = this->Array + local_1c;
      pWVar4 = other->Array + local_1c;
      pWVar3->Type = pWVar4->Type;
      uVar2 = *(undefined4 *)&pWVar4->field_0xc;
      pWVar3->Position = pWVar4->Position;
      *(undefined4 *)&pWVar3->field_0xc = uVar2;
    }
  }
  return;
}

Assistant:

void DoCopy (const TArray<T> &other)
	{
		Most = Count = other.Count;
		if (Count != 0)
		{
			Array = (T *)M_Malloc (sizeof(T)*Most);
			for (unsigned int i = 0; i < Count; ++i)
			{
				::new(&Array[i]) T(other.Array[i]);
			}
		}
		else
		{
			Array = NULL;
		}
	}